

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O3

TargetImageWidget * __thiscall TargetImageWidget::GetImageInViewTargetArea(TargetImageWidget *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  TargetImageWidget *in_RSI;
  int iVar6;
  QPainter p;
  QPointF local_30;
  double dStack_20;
  
  QImage::QImage((QImage *)this,0x1000,0x1000,Format_RGB32);
  QPainter::QPainter((QPainter *)&local_30,(QPaintDevice *)this);
  lVar3 = *(long *)&(in_RSI->super_PanAndZoomWidget).field_0x20;
  iVar4 = (*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1;
  iVar5 = (*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1;
  if (iVar4 <= iVar5) {
    iVar5 = iVar4;
  }
  QPainter::scale(4096.0 / (double)iVar5,4096.0 / (double)iVar5);
  lVar3 = *(long *)&(in_RSI->super_PanAndZoomWidget).field_0x20;
  uVar1 = *(undefined8 *)(lVar3 + 0x1c);
  uVar2 = *(undefined8 *)(lVar3 + 0x14);
  iVar4 = ((int)uVar1 - (int)uVar2) + 1;
  iVar6 = ((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1;
  iVar5 = iVar4;
  if (iVar6 < iVar4) {
    iVar5 = iVar6;
  }
  local_30.yp = ((double)iVar4 - (double)iVar5) * -0.5;
  dStack_20 = ((double)iVar6 - (double)iVar5) * -0.5;
  QPainter::translate(&local_30);
  PaintImage(in_RSI,(QPainter *)&local_30);
  QPainter::~QPainter((QPainter *)&local_30);
  return this;
}

Assistant:

QImage TargetImageWidget::GetImageInViewTargetArea() const
{
    const qreal rgbImageSize = 4096;
    QImage allRgbTarget(rgbImageSize, rgbImageSize, QImage::Format_RGB32);

    /*
     *  Our widget isn't 4096*4096, but we've aligned our image to this widget,
     *  so now we need to further scale our painter to account for this
     *  difference.
     */
    QPainter p(&allRgbTarget);
    qreal edge = std::min(width(), height());
    qreal scale = rgbImageSize / edge;
    p.scale(scale, scale);
    p.translate(-GetTargetRect().topLeft());

    PaintImage(p);

    return allRgbTarget;
}